

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O2

void test_dt_unsignedByte(void)

{
  char cVar1;
  bool bVar2;
  XSValue *pXVar3;
  char *pcVar4;
  wchar16 *pwVar5;
  long lVar6;
  char *pcVar7;
  void *pvVar8;
  int iVar9;
  int iVar10;
  Status myStatus;
  StrX local_b0;
  char lex_v_ran_iv_2 [3];
  char lex_v_ran_v_2 [2];
  char lex_v_ran_iv_1 [5];
  Status myStatus_14;
  char lex_v_ran_v_1 [5];
  char lex_v_ran_v_2_canrep [2];
  char lex_v_ran_iv_2_canrep [3];
  char lex_iv_2 [8];
  char lex_iv_1 [10];
  char data_canrep_2 [4];
  char data_canrep_1 [4];
  char lex_v_ran_iv_1_canrep [4];
  char lex_v_ran_v_1_canrep [4];
  char data_rawstr_2 [7];
  char data_rawstr_1 [11];
  char lex_v_ran_v_0 [11];
  
  builtin_strncpy(lex_v_ran_v_0,"   123   \n",0xb);
  builtin_strncpy(lex_v_ran_v_1,"+255",5);
  lex_v_ran_v_2[0] = '0';
  lex_v_ran_v_2[1] = '\0';
  builtin_strncpy(lex_v_ran_iv_1,"+256",5);
  lex_v_ran_iv_2[2] = '\0';
  lex_v_ran_iv_2[0] = '-';
  lex_v_ran_iv_2[1] = '1';
  builtin_strncpy(lex_v_ran_v_1_canrep,"255",4);
  lex_v_ran_v_2_canrep[0] = '0';
  lex_v_ran_v_2_canrep[1] = '\0';
  builtin_strncpy(lex_v_ran_iv_1_canrep,"256",4);
  lex_v_ran_iv_2_canrep[2] = '\0';
  lex_v_ran_iv_2_canrep[0] = '-';
  lex_v_ran_iv_2_canrep[1] = '1';
  builtin_strncpy(lex_iv_1,"12b34.456",10);
  builtin_strncpy(lex_iv_2,"1234b56",8);
  builtin_strncpy(data_rawstr_1,"   +123  \n",0xb);
  builtin_strncpy(data_canrep_1,"123",4);
  builtin_strncpy(data_rawstr_2,"000123",7);
  builtin_strncpy(data_canrep_2,"123",4);
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_b0,lex_v_ran_v_0);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_b0.fUnicodeForm,dt_unsignedByte,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_b0);
  if (cVar1 == '\0') {
    StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xb9f,lex_v_ran_v_0,local_b0.fLocalForm,1);
    StrX::~StrX(&local_b0);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_b0,lex_v_ran_v_1);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_b0.fUnicodeForm,dt_unsignedByte,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_b0);
  if (cVar1 == '\0') {
    StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xba0,lex_v_ran_v_1,local_b0.fLocalForm,1);
    StrX::~StrX(&local_b0);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_b0,lex_v_ran_v_2);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_b0.fUnicodeForm,dt_unsignedByte,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_b0);
  if (cVar1 == '\0') {
    StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xba1,lex_v_ran_v_2,local_b0.fLocalForm,1);
    StrX::~StrX(&local_b0);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_b0,lex_v_ran_iv_1);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_b0.fUnicodeForm,dt_unsignedByte,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_b0);
  if (cVar1 == '\0') {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      pcVar7 = local_b0.fLocalForm;
      pcVar4 = getStatusString(myStatus);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xba4,lex_v_ran_iv_1,pcVar7,"st_FOCA0002",pcVar4);
      goto LAB_0011823e;
    }
  }
  else {
    StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xba4,lex_v_ran_iv_1,local_b0.fLocalForm,0);
LAB_0011823e:
    StrX::~StrX(&local_b0);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_b0,lex_v_ran_iv_2);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_b0.fUnicodeForm,dt_unsignedByte,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_b0);
  if (cVar1 == '\0') {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      pcVar7 = local_b0.fLocalForm;
      pcVar4 = getStatusString(myStatus);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xba5,lex_v_ran_iv_2,pcVar7,"st_FOCA0002",pcVar4);
      goto LAB_00118308;
    }
  }
  else {
    StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xba5,lex_v_ran_iv_2,local_b0.fLocalForm,0);
LAB_00118308:
    StrX::~StrX(&local_b0);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_b0,lex_iv_1);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_b0.fUnicodeForm,dt_unsignedByte,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_b0);
  if (cVar1 == '\0') {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      pcVar7 = local_b0.fLocalForm;
      pcVar4 = getStatusString(myStatus);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xba8,lex_iv_1,pcVar7,"st_FOCA0002",pcVar4);
      goto LAB_001183d2;
    }
  }
  else {
    StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xba8,lex_iv_1,local_b0.fLocalForm,0);
LAB_001183d2:
    StrX::~StrX(&local_b0);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_b0,lex_iv_2);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_b0.fUnicodeForm,dt_unsignedByte,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_b0);
  if (cVar1 == '\0') {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      pcVar7 = local_b0.fLocalForm;
      pcVar4 = getStatusString(myStatus);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xba9,lex_iv_2,pcVar7,"st_FOCA0002",pcVar4);
      goto LAB_0011849c;
    }
  }
  else {
    StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xba9,lex_iv_2,local_b0.fLocalForm,0);
LAB_0011849c:
    StrX::~StrX(&local_b0);
    errSeen = 1;
  }
  iVar10 = 2;
  while (iVar9 = iVar10 + -1, iVar10 != 0) {
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_b0,lex_v_ran_v_0);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_b0.fUnicodeForm,dt_unsignedByte,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_b0);
    if (pXVar3 == (XSValue *)0x0) {
      StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbc6,lex_v_ran_v_0);
      StrX::~StrX(&local_b0);
      errSeen = 1;
    }
    else {
      pvVar8 = (void *)(ulong)(byte)pXVar3[8];
      if (pXVar3[8] != (XSValue)0x7b) {
        printf("ACTVALUE_TEST Unexpected dt_unsignedByte XSValue, got %d expected %d\n",pvVar8,0x7b)
        ;
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar8);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_b0,lex_v_ran_v_1);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_b0.fUnicodeForm,dt_unsignedByte,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_b0);
    if (pXVar3 == (XSValue *)0x0) {
      StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbc8,lex_v_ran_v_1);
      StrX::~StrX(&local_b0);
      errSeen = 1;
    }
    else {
      pvVar8 = (void *)(ulong)(byte)pXVar3[8];
      if (pXVar3[8] != (XSValue)0xff) {
        printf("ACTVALUE_TEST Unexpected dt_unsignedByte XSValue, got %d expected %d\n",pvVar8,0xff)
        ;
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar8);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_b0,lex_v_ran_v_2);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_b0.fUnicodeForm,dt_unsignedByte,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_b0);
    if (pXVar3 == (XSValue *)0x0) {
      StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbc9,lex_v_ran_v_2);
      StrX::~StrX(&local_b0);
      errSeen = 1;
    }
    else {
      pvVar8 = (void *)(ulong)(byte)pXVar3[8];
      if (pXVar3[8] != (XSValue)0x0) {
        printf("ACTVALUE_TEST Unexpected dt_unsignedByte XSValue, got %d expected %d\n",pvVar8,0);
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar8);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_b0,lex_v_ran_iv_1);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_b0.fUnicodeForm,dt_unsignedByte,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_b0);
    if (pXVar3 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
        pcVar7 = local_b0.fLocalForm;
        pcVar4 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xbca,lex_v_ran_iv_1,pcVar7,"st_FOCA0002",pcVar4);
        StrX::~StrX(&local_b0);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      pvVar8 = (void *)0xbca;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbca,lex_v_ran_iv_1);
      StrX::~StrX(&local_b0);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar8);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_b0,lex_v_ran_iv_2);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_b0.fUnicodeForm,dt_unsignedByte,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_b0);
    if (pXVar3 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
        pcVar7 = local_b0.fLocalForm;
        pcVar4 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xbcb,lex_v_ran_iv_2,pcVar7,"st_FOCA0002",pcVar4);
        StrX::~StrX(&local_b0);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      pvVar8 = (void *)0xbcb;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbcb,lex_v_ran_iv_2);
      StrX::~StrX(&local_b0);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar8);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_b0,lex_iv_1);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_b0.fUnicodeForm,dt_unsignedByte,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_b0);
    if (pXVar3 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
        pcVar7 = local_b0.fLocalForm;
        pcVar4 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xbcd,lex_iv_1,pcVar7,"st_FOCA0002",pcVar4);
        StrX::~StrX(&local_b0);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      pvVar8 = (void *)0xbcd;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbcd,lex_iv_1);
      StrX::~StrX(&local_b0);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar8);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_b0,lex_iv_2);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_b0.fUnicodeForm,dt_unsignedByte,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_b0);
    iVar10 = iVar9;
    if (pXVar3 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
        pcVar7 = local_b0.fLocalForm;
        pcVar4 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xbce,lex_iv_2,pcVar7,"st_FOCA0002",pcVar4);
        StrX::~StrX(&local_b0);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      pvVar8 = (void *)0xbce;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbce,lex_iv_2);
      StrX::~StrX(&local_b0);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar8);
    }
  }
  iVar10 = 2;
LAB_00118ac7:
  iVar9 = iVar10 + -1;
  if (iVar10 != 0) {
    myStatus_14 = st_Init;
    StrX::StrX(&local_b0,data_rawstr_1);
    pwVar5 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_b0.fUnicodeForm,dt_unsignedByte,&myStatus_14,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_b0);
    if (pwVar5 == (wchar16 *)0x0) {
      StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbec,data_rawstr_1);
      StrX::~StrX(&local_b0);
      errSeen = 1;
    }
    else {
      _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar5,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(_myStatus,data_canrep_1);
      if (!bVar2) {
        StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xbec,data_rawstr_1,local_b0.fLocalForm,_myStatus,data_canrep_1);
        StrX::~StrX(&local_b0);
        errSeen = 1;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar5);
      xercesc_4_0::XMLString::release
                ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    myStatus_14 = st_Init;
    StrX::StrX(&local_b0,data_rawstr_2);
    pwVar5 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_b0.fUnicodeForm,dt_unsignedByte,&myStatus_14,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_b0);
    if (pwVar5 == (wchar16 *)0x0) {
      StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbed,data_rawstr_2);
      StrX::~StrX(&local_b0);
      errSeen = 1;
    }
    else {
      _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar5,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(_myStatus,data_canrep_2);
      if (!bVar2) {
        StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xbed,data_rawstr_2,local_b0.fLocalForm,_myStatus,data_canrep_2);
        StrX::~StrX(&local_b0);
        errSeen = 1;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar5);
      xercesc_4_0::XMLString::release
                ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    myStatus_14 = st_Init;
    StrX::StrX(&local_b0,lex_v_ran_v_1);
    pwVar5 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_b0.fUnicodeForm,dt_unsignedByte,&myStatus_14,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_b0);
    if (pwVar5 == (wchar16 *)0x0) {
      StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbef,lex_v_ran_v_1);
      StrX::~StrX(&local_b0);
      errSeen = 1;
    }
    else {
      _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar5,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(_myStatus,lex_v_ran_v_1_canrep);
      if (!bVar2) {
        StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xbef,lex_v_ran_v_1,local_b0.fLocalForm,_myStatus,lex_v_ran_v_1_canrep);
        StrX::~StrX(&local_b0);
        errSeen = 1;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar5);
      xercesc_4_0::XMLString::release
                ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    myStatus_14 = st_Init;
    StrX::StrX(&local_b0,lex_v_ran_v_2);
    pwVar5 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_b0.fUnicodeForm,dt_unsignedByte,&myStatus_14,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_b0);
    if (pwVar5 == (wchar16 *)0x0) {
      StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbf0,lex_v_ran_v_2);
      StrX::~StrX(&local_b0);
      errSeen = 1;
    }
    else {
      _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar5,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(_myStatus,lex_v_ran_v_2_canrep);
      if (!bVar2) {
        StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xbf0,lex_v_ran_v_2,local_b0.fLocalForm,_myStatus,lex_v_ran_v_2_canrep);
        StrX::~StrX(&local_b0);
        errSeen = 1;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar5);
      xercesc_4_0::XMLString::release
                ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_b0,lex_iv_1);
    lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_b0.fUnicodeForm,dt_unsignedByte,&myStatus,ver_10,iVar10 == 2,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_b0);
    if (lVar6 == 0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
        pcVar7 = local_b0.fLocalForm;
        pcVar4 = getStatusString(myStatus);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xbf2,lex_iv_1,pcVar7,"st_FOCA0002",pcVar4);
        StrX::~StrX(&local_b0);
        goto LAB_00118fc9;
      }
    }
    else {
      StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbf2,lex_iv_1);
      StrX::~StrX(&local_b0);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_00118fc9:
      errSeen = 1;
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_b0,lex_iv_2);
    lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_b0.fUnicodeForm,dt_unsignedByte,&myStatus,ver_10,iVar10 == 2,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_b0);
    iVar10 = iVar9;
    if (lVar6 == 0) goto LAB_00119057;
    StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xbf3,lex_iv_2);
    StrX::~StrX(&local_b0);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
    goto LAB_001190a6;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_b0,lex_v_ran_iv_1);
  lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_b0.fUnicodeForm,dt_unsignedByte,&myStatus,ver_10,true,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_b0);
  if (lVar6 == 0) {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      pcVar7 = local_b0.fLocalForm;
      pcVar4 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xbf8,lex_v_ran_iv_1,pcVar7,"st_FOCA0002",pcVar4);
      StrX::~StrX(&local_b0);
      goto LAB_00119191;
    }
  }
  else {
    StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xbf8,lex_v_ran_iv_1);
    StrX::~StrX(&local_b0);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_00119191:
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_b0,lex_v_ran_iv_2);
  lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_b0.fUnicodeForm,dt_unsignedByte,&myStatus,ver_10,true,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_b0);
  if (lVar6 == 0) {
    if (myStatus == st_FOCA0002) goto LAB_0011927b;
    StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    pcVar7 = local_b0.fLocalForm;
    pcVar4 = getStatusString(myStatus);
    printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0xbf9,lex_v_ran_iv_2,pcVar7,"st_FOCA0002",pcVar4);
    StrX::~StrX(&local_b0);
  }
  else {
    StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xbf9,lex_v_ran_iv_2);
    StrX::~StrX(&local_b0);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
  }
  errSeen = 1;
LAB_0011927b:
  myStatus_14 = st_Init;
  StrX::StrX(&local_b0,lex_v_ran_iv_1);
  pwVar5 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_b0.fUnicodeForm,dt_unsignedByte,&myStatus_14,ver_10,false,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_b0);
  if (pwVar5 == (wchar16 *)0x0) {
    StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xbfc,lex_v_ran_iv_1);
    StrX::~StrX(&local_b0);
    errSeen = 1;
  }
  else {
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pwVar5,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    _myStatus = pcVar7;
    bVar2 = xercesc_4_0::XMLString::equals(pcVar7,lex_v_ran_iv_1_canrep);
    if (!bVar2) {
      StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0xbfc,lex_v_ran_iv_1,local_b0.fLocalForm,pcVar7,lex_v_ran_iv_1_canrep);
      StrX::~StrX(&local_b0);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar5);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  myStatus_14 = st_Init;
  StrX::StrX(&local_b0,lex_v_ran_iv_2);
  pwVar5 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_b0.fUnicodeForm,dt_unsignedByte,&myStatus_14,ver_10,false,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_b0);
  if (pwVar5 == (wchar16 *)0x0) {
    StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xbfd,lex_v_ran_iv_2,local_b0.fLocalForm);
    StrX::~StrX(&local_b0);
    errSeen = 1;
  }
  else {
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pwVar5,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    _myStatus = pcVar7;
    bVar2 = xercesc_4_0::XMLString::equals(pcVar7,lex_v_ran_iv_2_canrep);
    if (!bVar2) {
      StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0xbfd,lex_v_ran_iv_2,local_b0.fLocalForm,pcVar7,lex_v_ran_iv_2_canrep);
      StrX::~StrX(&local_b0);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar5);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  return;
LAB_00119057:
  if (myStatus != st_FOCA0002) {
    StrX::StrX(&local_b0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    pcVar7 = local_b0.fLocalForm;
    pcVar4 = getStatusString(myStatus);
    printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0xbf3,lex_iv_2,pcVar7,"st_FOCA0002",pcVar4);
    StrX::~StrX(&local_b0);
LAB_001190a6:
    errSeen = 1;
  }
  goto LAB_00118ac7;
}

Assistant:

void test_dt_unsignedByte()
{
    const XSValue::DataType dt = XSValue::dt_unsignedByte;
    bool  toValidate = true;

    const char lex_v_ran_v_0[]="   123   \n";

    const char lex_v_ran_v_1[]="+255";
    const char lex_v_ran_v_2[]="0";
    const char lex_v_ran_iv_1[]="+256";
    const char lex_v_ran_iv_2[]="-1";

    XSValue::XSValue_Data act_v_ran_v_0;  act_v_ran_v_0.fValue.f_uchar = (unsigned char)123;
    XSValue::XSValue_Data act_v_ran_v_1;  act_v_ran_v_1.fValue.f_uchar = (unsigned char)+255;
    XSValue::XSValue_Data act_v_ran_v_2;  act_v_ran_v_2.fValue.f_uchar = (unsigned char)0;

    const char lex_v_ran_v_1_canrep[]="255";
    const char lex_v_ran_v_2_canrep[]="0";
    const char lex_v_ran_iv_1_canrep[]="256";
    const char lex_v_ran_iv_2_canrep[]="-1";

    const char lex_iv_1[]="12b34.456";
    const char lex_iv_2[]="1234b56";

/***
 * 3.3.24.2 Canonical representation
 *
 * The canonical representation for unsignedByte is defined by prohibiting certain options from the
 * Lexical representation (3.3.24.1). Specifically,
 * 1. leading zeroes are prohibited.
 *
 ***/

    const char data_rawstr_1[]="   +123  \n";
    const char data_canrep_1[]="123";
    const char data_rawstr_2[]="000123";
    const char data_canrep_2[]="123";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid
     *            range  valid                           true              n/a
     *            range  invalid                         false           st_FOCA0002
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid, valid range
    VALIDATE_TEST(lex_v_ran_v_0  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_1  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_2  , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical valid, invalid range
    VALIDATE_TEST(lex_v_ran_iv_1 , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_v_ran_iv_2 , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        ACTVALUE_TEST(lex_v_ran_v_0,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_0);

        ACTVALUE_TEST(lex_v_ran_v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(lex_v_ran_v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(lex_v_ran_iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_v_ran_iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);

        ACTVALUE_TEST(lex_iv_1,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_iv_2,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid                              0            st_FOCA0002
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XMLCh         n/a
     *          range  invalid                            XMLCh         n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j)? true : false;

        CANREP_TEST(data_rawstr_1,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_1,    DONT_CARE);
        CANREP_TEST(data_rawstr_2,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_2,    XSValue::st_FOCA0002);

        CANREP_TEST(lex_v_ran_v_1,  dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_v_1_canrep,  DONT_CARE);
        CANREP_TEST(lex_v_ran_v_2,  dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_v_2_canrep,  DONT_CARE);

        CANREP_TEST(lex_iv_1        , dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2        , dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);

    }

    //validation on
    CANREP_TEST(lex_v_ran_iv_1, dt, true,  EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
    CANREP_TEST(lex_v_ran_iv_2, dt, true,  EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);

    //validation off
    CANREP_TEST(lex_v_ran_iv_1, dt, false, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_1_canrep, DONT_CARE);
    CANREP_TEST(lex_v_ran_iv_2, dt, false, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_2_canrep, DONT_CARE);
}